

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<false,_false,_false>::doWalkFunction
          (SimplifyLocals<false,_false,_false> *this,Function *func)

{
  bool bVar1;
  size_t sVar2;
  ReFinalize local_158;
  
  sVar2 = Function::getNumLocals(func);
  if (sVar2 != 0) {
    LocalGetCounter::analyze(&this->getCounter,func);
    this->firstCycle = true;
    do {
      bVar1 = runMainOptimizations(this,func);
      this->anotherCycle = bVar1;
      if (this->firstCycle == true) {
        this->firstCycle = false;
LAB_009b350c:
        this->anotherCycle = true;
      }
      else if (!bVar1) {
        bVar1 = runLateOptimizations(this,func);
        if (bVar1) {
          bVar1 = runMainOptimizations(this,func);
          if (bVar1) goto LAB_009b350c;
        }
      }
    } while (this->anotherCycle != false);
    if (this->refinalize == true) {
      ReFinalize::ReFinalize(&local_158);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_158.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 func,(this->
                      super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                      ).
                      super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      .
                      super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      .
                      super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                      .currModule);
      ReFinalize::~ReFinalize(&local_158);
    }
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    if (func->getNumLocals() == 0) {
      return; // nothing to do
    }
    // scan local.gets
    getCounter.analyze(func);
    // multiple passes may be required per function, consider this:
    //    x = load
    //    y = store
    //    c(x, y)
    // the load cannot cross the store, but y can be sunk, after which so can x.
    //
    // we start with a cycle focusing on single-use locals, which are easy to
    // sink (we don't need to put a set), and a good match for common compiler
    // output patterns. further cycles do fully general sinking.
    firstCycle = true;
    do {
      anotherCycle = runMainOptimizations(func);
      // After the special first cycle, definitely do another.
      if (firstCycle) {
        firstCycle = false;
        anotherCycle = true;
      }
      // If we are all done, run the final optimizations, which may suggest we
      // can do more work.
      if (!anotherCycle) {
        // Don't run multiple cycles of just the final optimizations - in
        // particular, get canonicalization is not guaranteed to converge.
        // Instead, if final opts help then see if they enable main
        // opts; continue only if they do. In other words, do not end up
        // doing final opts again and again when no main opts are being
        // enabled.
        if (runLateOptimizations(func) && runMainOptimizations(func)) {
          anotherCycle = true;
        }
      }
    } while (anotherCycle);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, this->getModule());
    }
  }